

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::Option::Option
          (Option *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->opts_)._M_dataplus._M_p = (pointer)&(this->opts_).field_2;
  pcVar1 = (opts->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + opts->_M_string_length);
  (this->desc_)._M_dataplus._M_p = (pointer)&(this->desc_).field_2;
  pcVar1 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->desc_,pcVar1,pcVar1 + desc->_M_string_length);
  (this->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (value->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (value->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  (this->value_).super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->arg_help_)._M_dataplus._M_p = (pointer)&(this->arg_help_).field_2;
  pcVar1 = (arg_help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arg_help_,pcVar1,pcVar1 + arg_help->_M_string_length);
  return;
}

Assistant:

Option
    (
      const std::string& opts,
      const std::string& desc,
      const std::shared_ptr<const Value>& value = ::cxxopts::value<bool>(),
      const std::string& arg_help = ""
    )
    : opts_(opts)
    , desc_(desc)
    , value_(value)
    , arg_help_(arg_help)
    {
    }